

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_5292d::Pools::~Pools(Pools *this)

{
  size_type sVar1;
  reference ppuVar2;
  uint local_14;
  index_t i;
  Pools *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(&this->chunks_);
    if (sVar1 <= local_14) break;
    ppuVar2 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                        (&this->chunks_,(ulong)local_14);
    if (*ppuVar2 != (value_type)0x0) {
      operator_delete__(*ppuVar2);
    }
    local_14 = local_14 + 1;
  }
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector(&this->chunks_);
  std::vector<void_*,_std::allocator<void_*>_>::~vector(&this->pools_);
  return;
}

Assistant:

~Pools() {
            for(index_t i=0; i<chunks_.size(); ++i) {
                delete[] chunks_[i];
            }
        }